

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O0

char * __cxxabiv1::anon_unknown_0::parse_unqualified_name<__cxxabiv1::(anonymous_namespace)::Db>
                 (char *first,char *last,Db *db)

{
  int iVar1;
  char *pcVar2;
  char *in_RSI;
  char *in_RDI;
  char *t;
  Db *in_stack_000000f8;
  char *in_stack_00000100;
  Db *in_stack_00000108;
  char *in_stack_00000110;
  char *in_stack_00000118;
  Db *in_stack_00000198;
  char *in_stack_000001a0;
  char *in_stack_000001a8;
  Db *in_stack_00000ec8;
  char *in_stack_00000ed0;
  char *in_stack_00000ed8;
  undefined8 local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    iVar1 = (int)*in_RDI;
    if (iVar1 - 0x31U < 9) {
      pcVar2 = parse_source_name<__cxxabiv1::(anonymous_namespace)::Db>
                         (in_stack_00000118,in_stack_00000110,in_stack_00000108);
      local_8 = in_RDI;
      if (pcVar2 != in_RDI) {
        local_8 = pcVar2;
      }
    }
    else if (iVar1 - 0x43U < 2) {
      pcVar2 = parse_ctor_dtor_name<__cxxabiv1::(anonymous_namespace)::Db>
                         ((char *)in_stack_00000108,in_stack_00000100,in_stack_000000f8);
      local_8 = in_RDI;
      if (pcVar2 != in_RDI) {
        local_8 = pcVar2;
      }
    }
    else if (iVar1 == 0x55) {
      pcVar2 = parse_unnamed_type_name<__cxxabiv1::(anonymous_namespace)::Db>
                         (in_stack_000001a8,in_stack_000001a0,in_stack_00000198);
      local_8 = in_RDI;
      if (pcVar2 != in_RDI) {
        local_8 = pcVar2;
      }
    }
    else {
      pcVar2 = parse_operator_name<__cxxabiv1::(anonymous_namespace)::Db>
                         (in_stack_00000ed8,in_stack_00000ed0,in_stack_00000ec8);
      local_8 = in_RDI;
      if (pcVar2 != in_RDI) {
        local_8 = pcVar2;
      }
    }
  }
  return local_8;
}

Assistant:

const char*
parse_unqualified_name(const char* first, const char* last, C& db)
{
    if (first != last)
    {
        const char* t;
        switch (*first)
        {
        case 'C':
        case 'D':
            t = parse_ctor_dtor_name(first, last, db);
            if (t != first)
                first = t;
            break;
        case 'U':
            t = parse_unnamed_type_name(first, last, db);
            if (t != first)
                first = t;
            break;
        case '1':
        case '2':
        case '3':
        case '4':
        case '5':
        case '6':
        case '7':
        case '8':
        case '9':
            t = parse_source_name(first, last, db);
            if (t != first)
                first = t;
            break;
        default:
            t = parse_operator_name(first, last, db);
            if (t != first)
                first = t;
            break;
        };
    }
    return first;
}